

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v5::internal::
       parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,char,std::char_traits<char>>,char>>>&,char>>
                 (char *begin,char *end,
                 width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_>_&,_char>
                 *handler)

{
  byte bVar1;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_>
  *psVar2;
  type tVar3;
  byte *pbVar4;
  byte *pbVar5;
  basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char> *this;
  uint arg_id;
  byte *pbVar6;
  basic_format_specs<char> *pbVar7;
  basic_string_view<char> name;
  error_handler local_71;
  width_checker<fmt::v5::internal::error_handler> local_70;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_1
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_1
  local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    pbVar7 = (handler->handler->
             super_specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
             ).super_specs_setter<char>.specs_;
    basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>::next_arg
              ((format_arg *)&local_68.string,
               (handler->handler->
               super_specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
               ).context_);
LAB_001e8c06:
    local_38 = local_58;
    uStack_30 = uStack_50;
    local_48.long_long_value = local_68.long_long_value;
    local_48.string.size = local_68.string.size;
    local_70.handler_ = &local_71;
    tVar3 = visit_format_arg<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
                      (&local_70,
                       (basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
                        *)&local_48.string);
    if ((tVar3 & 0xffffffff80000000) != 0) {
      error_handler::on_error(&local_71,"number is too big");
    }
    (pbVar7->super_align_spec).width_ = (uint)tVar3;
  }
  else {
    if ((byte)(bVar1 - 0x30) < 10) {
      begin = begin + 1;
      arg_id = 0;
      pbVar5 = (byte *)begin;
      if (bVar1 != 0x30) {
        do {
          if (0xccccccc < arg_id) {
            begin = (char *)(pbVar5 + -1);
            arg_id = 0x80000000;
            goto LAB_001e8d6c;
          }
          arg_id = ((uint)bVar1 + arg_id * 10) - 0x30;
          begin = end;
          if (pbVar5 == (byte *)end) break;
          bVar1 = *pbVar5;
          begin = (char *)pbVar5;
          pbVar5 = pbVar5 + 1;
        } while ((byte)(bVar1 - 0x30) < 10);
        if ((int)arg_id < 0) {
LAB_001e8d6c:
          error_handler::on_error
                    ((error_handler *)
                     (handler->handler->
                     super_specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
                     ).context_,"number is too big");
        }
      }
      if ((begin != end) && ((*begin == 0x3a || (*begin == 0x7d)))) {
        psVar2 = handler->handler;
        pbVar7 = (psVar2->
                 super_specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
                 ).super_specs_setter<char>.specs_;
        this = (psVar2->
               super_specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
               ).context_;
        if ((this->
            super_context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
            ).parse_context_.next_arg_id_ < 1) {
          (this->
          super_context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
          ).parse_context_.next_arg_id_ = -1;
        }
        else {
          error_handler::on_error
                    ((error_handler *)this,
                     "cannot switch from automatic to manual argument indexing");
          this = (psVar2->
                 super_specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
                 ).context_;
        }
        context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
        ::do_get_arg((format_arg *)&local_68.string,
                     &this->
                      super_context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
                     ,arg_id);
        goto LAB_001e8c06;
      }
    }
    else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      pbVar5 = (byte *)(begin + 1);
      do {
        pbVar4 = pbVar5;
        pbVar6 = (byte *)end;
        if (pbVar4 == (byte *)end) break;
        bVar1 = *pbVar4;
        pbVar5 = pbVar4 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              (pbVar6 = pbVar4, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      name.size_ = (long)pbVar6 - (long)begin;
      pbVar7 = (handler->handler->
               super_specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
               ).super_specs_setter<char>.specs_;
      name.data_ = begin;
      basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>::
      get_arg((format_arg *)&local_68.string,
              (handler->handler->
              super_specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
              ).context_,name);
      local_38 = local_58;
      uStack_30 = uStack_50;
      local_48.long_long_value = local_68.long_long_value;
      local_48.string.size = local_68.string.size;
      local_70.handler_ = &local_71;
      tVar3 = visit_format_arg<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
                        (&local_70,
                         (basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
                          *)&local_48.string);
      if ((tVar3 & 0xffffffff80000000) != 0) {
        error_handler::on_error(&local_71,"number is too big");
      }
      (pbVar7->super_align_spec).width_ = (uint)tVar3;
      return (char *)pbVar6;
    }
    error_handler::on_error
              ((error_handler *)
               (handler->handler->
               super_specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
               ).context_,"invalid format string");
  }
  return (char *)(byte *)begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}